

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
copyTo(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
       *this,OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
             *copy)

{
  vec<Glucose::Solver::Watcher> *pvVar1;
  vec<Glucose::Solver::Watcher> *pvVar2;
  long lVar3;
  long lVar4;
  
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&copy->occs,(this->occs).sz);
  if (0 < (this->occs).sz) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      pvVar1 = (this->occs).data;
      pvVar2 = (copy->occs).data;
      vec<Glucose::Solver::Watcher>::capacity
                ((vec<Glucose::Solver::Watcher> *)((long)&pvVar2->data + lVar4),
                 *(int *)((long)&pvVar1->cap + lVar4));
      *(undefined4 *)((long)&pvVar2->sz + lVar4) = *(undefined4 *)((long)&pvVar1->sz + lVar4);
      memcpy(*(void **)((long)&pvVar2->data + lVar4),*(void **)((long)&pvVar1->data + lVar4),
             (long)*(int *)((long)&pvVar1->cap + lVar4) << 3);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < (this->occs).sz);
  }
  vec<char>::capacity(&copy->dirty,(this->dirty).cap);
  (copy->dirty).sz = (this->dirty).sz;
  memcpy((copy->dirty).data,(this->dirty).data,(long)(this->dirty).cap);
  vec<Glucose::Lit>::capacity(&copy->dirties,(this->dirties).cap);
  (copy->dirties).sz = (this->dirties).sz;
  memcpy((copy->dirties).data,(this->dirties).data,(long)(this->dirties).cap << 2);
  return;
}

Assistant:

void copyTo(OccLists &copy) const {
	
	copy.occs.growTo(occs.size());
	for(int i = 0;i<occs.size();i++)
	    occs[i].memCopyTo(copy.occs[i]);
	dirty.memCopyTo(copy.dirty);
	dirties.memCopyTo(copy.dirties);
    }